

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_buffering.c
# Opt level: O1

uint64_t bigendian_decode_u64(uint8_t *bytes)

{
  uint64_t uVar1;
  
  uVar1 = swap_bytes(*(undefined8 *)bytes);
  return uVar1;
}

Assistant:

ASCON_INLINE uint64_t
bigendian_decode_u64(const uint8_t* const bytes)
{
    uint64_t value = 0;
    value |= ((uint64_t) bytes[0]) << 56U;
    value |= ((uint64_t) bytes[1]) << 48U;
    value |= ((uint64_t) bytes[2]) << 40U;
    value |= ((uint64_t) bytes[3]) << 32U;
    value |= ((uint64_t) bytes[4]) << 24U;
    value |= ((uint64_t) bytes[5]) << 16U;
    value |= ((uint64_t) bytes[6]) << 8U;
    value |= ((uint64_t) bytes[7]);
    return value;
}